

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_select.c
# Opt level: O0

ssize_t tnt_select(tnt_stream *s,uint32_t space,uint32_t index,uint32_t limit,uint32_t offset,
                  uint8_t iterator,tnt_stream *key)

{
  uint64_t sync;
  int iVar1;
  char *pcVar2;
  char *len_end;
  char len_prefix [9];
  int i;
  size_t package_len;
  char body [64];
  char *data;
  undefined1 auStack_98 [4];
  int v_sz;
  iovec v [4];
  tnt_iheader hdr;
  uint8_t iterator_local;
  uint32_t offset_local;
  uint32_t limit_local;
  uint32_t index_local;
  uint32_t space_local;
  tnt_stream *s_local;
  
  iVar1 = tnt_object_verify(key,'\x05');
  if (iVar1 == 0) {
    body[0x38] = '\0';
    body[0x39] = '\0';
    body[0x3a] = '\0';
    body[0x3b] = '\0';
    body[0x3c] = '\0';
    body[0x3d] = '\0';
    body[0x3e] = '\0';
    body[0x3f] = '\0';
    sync = s->reqid;
    s->reqid = sync + 1;
    encode_header((tnt_iheader *)&v[3].iov_len,1,sync);
    v[0].iov_len = (size_t)&v[3].iov_len;
    v[1].iov_base = (void *)(hdr._24_8_ - (long)&v[3].iov_len);
    body._56_8_ = &package_len;
    body._56_8_ = mp_encode_map((char *)body._56_8_,6);
    body._56_8_ = mp_encode_uint((char *)body._56_8_,0x10);
    body._56_8_ = mp_encode_uint((char *)body._56_8_,(ulong)space);
    body._56_8_ = mp_encode_uint((char *)body._56_8_,0x11);
    body._56_8_ = mp_encode_uint((char *)body._56_8_,(ulong)index);
    body._56_8_ = mp_encode_uint((char *)body._56_8_,0x12);
    body._56_8_ = mp_encode_uint((char *)body._56_8_,(ulong)limit);
    body._56_8_ = mp_encode_uint((char *)body._56_8_,0x13);
    body._56_8_ = mp_encode_uint((char *)body._56_8_,(ulong)offset);
    body._56_8_ = mp_encode_uint((char *)body._56_8_,0x14);
    body._56_8_ = mp_encode_uint((char *)body._56_8_,(ulong)iterator);
    body._56_8_ = mp_encode_uint((char *)body._56_8_,0x20);
    v[1].iov_len = (size_t)&package_len;
    v[2].iov_base = (char *)(body._56_8_ + -(long)&package_len);
    v[2].iov_len = *key->data;
    v[3].iov_base = *(void **)((long)key->data + 8);
    stack0xffffffffffffff10 = 0;
    len_prefix[1] = '\x01';
    len_prefix[2] = '\0';
    len_prefix[3] = '\0';
    len_prefix[4] = '\0';
    for (; (int)len_prefix._1_4_ < 4; len_prefix._1_4_ = len_prefix._1_4_ + 1) {
      register0x00000000 = (long)v[(int)len_prefix._1_4_].iov_base + stack0xffffffffffffff10;
    }
    pcVar2 = mp_encode_luint32((char *)((long)&len_end + 3),stack0xffffffffffffff10);
    _auStack_98 = (void *)((long)&len_end + 3);
    v[0].iov_base = pcVar2 + -((long)&len_end + 3);
    s_local = (tnt_stream *)(*s->writev)(s,(iovec *)auStack_98,4);
  }
  else {
    s_local = (tnt_stream *)0xffffffffffffffff;
  }
  return (ssize_t)s_local;
}

Assistant:

ssize_t
tnt_select(struct tnt_stream *s, uint32_t space, uint32_t index,
	   uint32_t limit, uint32_t offset, uint8_t iterator,
	   struct tnt_stream *key)
{
	if (tnt_object_verify(key, MP_ARRAY))
		return -1;
	struct tnt_iheader hdr;
	struct iovec v[4]; int v_sz = 4;
	char *data = NULL;
	encode_header(&hdr, TNT_OP_SELECT, s->reqid++);
	v[1].iov_base = (void *)hdr.header;
	v[1].iov_len  = hdr.end - hdr.header;
	char body[64]; data = body;

	data = mp_encode_map(data, 6);
	data = mp_encode_uint(data, TNT_SPACE);
	data = mp_encode_uint(data, space);
	data = mp_encode_uint(data, TNT_INDEX);
	data = mp_encode_uint(data, index);
	data = mp_encode_uint(data, TNT_LIMIT);
	data = mp_encode_uint(data, limit);
	data = mp_encode_uint(data, TNT_OFFSET);
	data = mp_encode_uint(data, offset);
	data = mp_encode_uint(data, TNT_ITERATOR);
	data = mp_encode_uint(data, iterator);
	data = mp_encode_uint(data, TNT_KEY);
	v[2].iov_base = body;
	v[2].iov_len  = data - body;
	v[3].iov_base = TNT_SBUF_DATA(key);
	v[3].iov_len  = TNT_SBUF_SIZE(key);

	size_t package_len = 0;
	for (int i = 1; i < v_sz; ++i)
		package_len += v[i].iov_len;
	char len_prefix[9];
	char *len_end = mp_encode_luint32(len_prefix, package_len);
	v[0].iov_base = len_prefix;
	v[0].iov_len = len_end - len_prefix;
	return s->writev(s, v, v_sz);
}